

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.hpp
# Opt level: O0

double __thiscall units::uncertain_measurement::fractional_uncertainty(uncertain_measurement *this)

{
  uncertain_measurement *in_RDI;
  double dVar1;
  float local_1c;
  
  dVar1 = uncertainty(in_RDI);
  if (in_RDI->value_ < 0.0) {
    local_1c = -in_RDI->value_;
  }
  else {
    local_1c = in_RDI->value_;
  }
  return dVar1 / (double)local_1c;
}

Assistant:

constexpr double fractional_uncertainty() const
    {
        return uncertainty() /
            static_cast<double>((value_ >= 0.0F) ? value_ : -value_);
    }